

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::recalculateLoci
          (HierarchicalTaskNetworkComponent *this,
          vector<int,_std::allocator<int>_> *updatedLociIndices)

{
  int iVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  reference piVar5;
  reference this_00;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  float fVar9;
  double dVar10;
  float local_ec;
  float local_e4;
  Vector3 local_c8;
  Vector3 local_bc;
  double local_b0;
  double speed;
  float local_a0;
  undefined4 local_9c;
  Vector3 local_98;
  float local_8c;
  reference pEStack_88;
  float distance;
  Engram *engram;
  iterator __end2;
  iterator __begin2;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *__range2;
  int i;
  float averageSpeed;
  float maxIntensity;
  float averageIntensity;
  float maxDistance;
  uint pastDistanceCount;
  value_type *origin;
  value_type *locus;
  iterator iStack_38;
  int id;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  float maxDistanceToOrigin;
  vector<int,_std::allocator<int>_> *updatedLociIndices_local;
  HierarchicalTaskNetworkComponent *this_local;
  
  __end1 = std::vector<int,_std::allocator<int>_>::begin(updatedLociIndices);
  iStack_38 = std::vector<int,_std::allocator<int>_>::end(updatedLociIndices);
  while (bVar4 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8), bVar4) {
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    this_00 = std::vector<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>::operator[]
                        (&(this->state).memory.focusLocus,(long)*piVar5);
    pvVar6 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[](&this_00->engrams,0);
    averageIntensity = 0.0;
    maxIntensity = 10000.0;
    averageSpeed = 0.0;
    i = 0;
    __range2._4_4_ = 0.0;
    __range2._0_4_ = 0;
    __end2 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::begin(&this_00->engrams);
    engram = (Engram *)std::vector<AI::Engram,_std::allocator<AI::Engram>_>::end(&this_00->engrams);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                                       *)&engram), bVar4) {
      pEStack_88 = __gnu_cxx::
                   __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                   ::operator*(&__end2);
      local_98.x = (pvVar6->stimulus).x;
      local_98.y = (pvVar6->stimulus).y;
      local_98.z = 0.0;
      speed._4_4_ = (pEStack_88->stimulus).x;
      local_a0 = (pEStack_88->stimulus).y;
      local_9c = 0;
      local_8c = Math::distanceSquared(&local_98,(Vector3 *)((long)&speed + 4));
      if (10000.0 < local_8c) {
        averageIntensity = (float)((int)averageIntensity + 1);
      }
      dVar10 = (double)maxIntensity;
      dVar2 = (double)local_8c;
      dVar3 = dVar2;
      if (dVar2 <= dVar10) {
        dVar3 = dVar10;
      }
      maxIntensity = (float)(double)(~-(ulong)NAN(dVar10) & (ulong)dVar3 |
                                    -(ulong)NAN(dVar10) & (ulong)dVar2);
      dVar10 = (double)(float)i;
      dVar2 = (double)(pEStack_88->stimulus).intensity;
      dVar3 = dVar2;
      if (dVar2 <= dVar10) {
        dVar3 = dVar10;
      }
      i = (int)(float)(double)(~-(ulong)NAN(dVar10) & (ulong)dVar3 |
                              -(ulong)NAN(dVar10) & (ulong)dVar2);
      averageSpeed = (pEStack_88->stimulus).intensity + averageSpeed;
      if (0 < (int)__range2) {
        pvVar7 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                           (&this_00->engrams,(long)(int)__range2);
        local_bc.x = (pvVar7->stimulus).x;
        pvVar7 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                           (&this_00->engrams,(long)(int)__range2);
        local_bc.y = (pvVar7->stimulus).y;
        local_bc.z = 0.0;
        pvVar7 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                           (&this_00->engrams,(long)((int)__range2 + -1));
        local_c8.x = (pvVar7->stimulus).x;
        pvVar7 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                           (&this_00->engrams,(long)((int)__range2 + -1));
        local_c8.y = (pvVar7->stimulus).y;
        local_c8.z = 0.0;
        fVar9 = Math::distanceSquared(&local_bc,&local_c8);
        pvVar7 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                           (&this_00->engrams,(long)((int)__range2 + -1));
        iVar1 = pvVar7->age;
        pvVar7 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                           (&this_00->engrams,(long)(int)__range2);
        local_b0 = (double)(iVar1 - pvVar7->age);
        if (local_b0 <= 1.0) {
          local_b0 = 1.0;
        }
        local_b0 = (double)fVar9 / local_b0;
        __range2._4_4_ = (float)((double)__range2._4_4_ + local_b0);
      }
      __range2._0_4_ = (int)__range2 + 1;
      __gnu_cxx::
      __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>::
      operator++(&__end2);
    }
    sVar8 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::size(&this_00->engrams);
    local_e4 = (float)sVar8;
    sVar8 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::size(&this_00->engrams);
    local_ec = (float)(sVar8 - 1);
    sVar8 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::size(&this_00->engrams);
    if ((uint)((int)averageIntensity << 1) < sVar8) {
      this_00->type = Area;
      this_00->field_1 = (anon_union_4_2_313644d9_for_FocusLocus_1)0x42c80000;
      this_00->currentImportance = (float)i;
    }
    else {
      this_00->type = Path;
      this_00->currentImportance = averageSpeed / local_e4 + __range2._4_4_ / local_ec;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::recalculateLoci(std::vector<int> updatedLociIndices)
{
	const float maxDistanceToOrigin = 100.f * 100.f;
	
	for(auto id : updatedLociIndices)
	{
		//if all engrams are within a certain radius of the starting one, its an area loci
		//otherwise, its path
		auto& locus = state.memory.focusLocus[id];
		auto& origin = locus.engrams[0];
		unsigned int pastDistanceCount = 0;
		float maxDistance = maxDistanceToOrigin;
		float averageIntensity = 0.f;
		float maxIntensity = 0.f;
		float averageSpeed = 0.f;

		int i = 0;
		for (auto& engram : locus.engrams)
		{
			auto distance = distanceSquared({origin.stimulus.x, origin.stimulus.y, 0.f}, {engram.stimulus.x, engram.stimulus.y, 0.f});

			if (distance > maxDistanceToOrigin)
			{
				pastDistanceCount++;
			}

			maxDistance = fmax(maxDistance, distance);

			maxIntensity = fmax(maxIntensity, engram.stimulus.intensity);
			averageIntensity += engram.stimulus.intensity;

			if (i > 0)
			{
				auto speed = 
					distanceSquared(
						{locus.engrams[i].stimulus.x, locus.engrams[i].stimulus.y, 0.f},
						{locus.engrams[i - 1].stimulus.x, locus.engrams[i - 1].stimulus.y, 0.f})
					/ fmax(locus.engrams[i - 1].age - locus.engrams[i].age, 1);

				averageSpeed += speed;
			}

			i++;
		}

		averageIntensity /= locus.engrams.size();
		averageSpeed /= (locus.engrams.size() - 1);

		if (pastDistanceCount * 2u >= locus.engrams.size())
		{
			locus.type = FocusLocusType::Path;
			locus.currentImportance = averageIntensity + averageSpeed;
		}
		else
		{
			locus.type = FocusLocusType::Area;
			locus.area.radius = 100.f;
			locus.currentImportance = maxIntensity;
		}	
	}
}